

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Regex.h
# Opt level: O0

Element * __thiscall Regex::Element::getLastChild(Element *this)

{
  Element *local_20;
  Element *c;
  Element *this_local;
  
  if (this->mChild == (Element *)0x0) {
    this_local = (Element *)0x0;
  }
  else {
    for (local_20 = this->mChild; local_20->mNext != (Element *)0x0; local_20 = local_20->mNext) {
    }
    this_local = local_20;
  }
  return this_local;
}

Assistant:

Element *getLastChild()
		{
			if ( mChild != NULL )
			{
				Element *c = mChild;
				while( c->mNext != NULL )
					c = c->mNext;
	
				return c;
			}

			return NULL;
		}